

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_column.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
::_prune(Heap_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
         *this)

{
  pointer ppEVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  Column_support tempCol;
  Entry *pivot;
  pointer local_38;
  iterator iStack_30;
  pointer local_28;
  Entry *local_20;
  
  if (this->insertsSinceLastPrune_ != 0) {
    local_38 = (pointer)0x0;
    iStack_30._M_current =
         (Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>
          **)0x0;
    local_28 = (pointer)0x0;
    local_20 = _pop_pivot(this);
    while (local_20 != (Entry *)0x0) {
      if (iStack_30._M_current == local_28) {
        std::
        vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
        ::
        _M_realloc_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*const&>
                  ((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)2,false,false,false>>>*>>
                    *)&local_38,iStack_30,&local_20);
      }
      else {
        *iStack_30._M_current = local_20;
        iStack_30._M_current = iStack_30._M_current + 1;
      }
      local_20 = _pop_pivot(this);
    }
    ppEVar1 = (this->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppEVar2 = (this->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppEVar3 = (this->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->column_).
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_start = local_38;
    (this->column_).
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = iStack_30._M_current;
    (this->column_).
    super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)2,_false,_false,_false>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_28;
    this->insertsSinceLastPrune_ = 0;
    if (ppEVar1 != (pointer)0x0) {
      local_38 = ppEVar1;
      iStack_30._M_current = ppEVar2;
      local_28 = ppEVar3;
      operator_delete(ppEVar1,(long)ppEVar3 - (long)ppEVar1);
    }
  }
  return;
}

Assistant:

inline void Heap_column<Master_matrix>::_prune()
{
  if (insertsSinceLastPrune_ == 0) return;

  Column_support tempCol;
  Entry* pivot = _pop_pivot();
  while (pivot != nullptr) {
    tempCol.push_back(pivot);
    pivot = _pop_pivot();
  }
  column_.swap(tempCol);

  insertsSinceLastPrune_ = 0;
}